

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadSafeRingBuffer.hpp
# Opt level: O0

void __thiscall
de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
          (ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*> *this,Task **elem)

{
  Task **elem_local;
  ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*> *this_local;
  
  Mutex::lock(&this->m_writeMutex);
  Semaphore::decrement(&this->m_empty);
  pushFrontInternal(this,elem);
  Semaphore::increment(&this->m_fill);
  Mutex::unlock(&this->m_writeMutex);
  return;
}

Assistant:

void ThreadSafeRingBuffer<T>::pushFront (const T& elem)
{
	m_writeMutex.lock();
	m_empty.decrement();
	pushFrontInternal(elem);
	m_fill.increment();
	m_writeMutex.unlock();
}